

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O3

Var Js::JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>
              (Var aValue,ScriptContext *requestContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  JavascriptTypedNumber<unsigned_long> *this_00;
  Var pvVar6;
  JavascriptString *value;
  JavascriptTypedNumber<long> *this_01;
  JavascriptDate *this_02;
  ScriptContext *objectScriptContext;
  double value_00;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a8ffc7;
    *puVar5 = 0;
  }
  else {
    if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (bVar3) {
        *puVar5 = 0;
        return aValue;
      }
      goto LAB_00a8ffc7;
    }
    if ((ulong)aValue >> 0x32 != 0 || ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
      return aValue;
    }
  }
  this = UnsafeVarTo<Js::RecyclableObject>(aValue);
  if (this == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a8ffc7;
    *puVar5 = 0;
  }
  TVar1 = ((this->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar3) {
LAB_00a8ffc7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if ((int)TVar1 < 7) {
    if (TVar1 < TypeIds_Int64Number) {
      return aValue;
    }
    if (TVar1 == TypeIds_Int64Number) {
      this_01 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
      pvVar6 = JavascriptTypedNumber<long>::ToJavascriptNumber(this_01);
      return pvVar6;
    }
    if (TVar1 == TypeIds_LastNumberType) {
      this_00 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
      pvVar6 = JavascriptTypedNumber<unsigned_long>::ToJavascriptNumber(this_00);
      return pvVar6;
    }
  }
  else if ((int)TVar1 < 0x22) {
    if (TVar1 - TypeIds_String < 3) {
      return aValue;
    }
  }
  else if ((int)TVar1 < 0x27) {
    if (TVar1 == TypeIds_Date) {
      this_02 = UnsafeVarTo<Js::JavascriptDate>(aValue);
      if (((((((((this_02->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary)
              .ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->optimizationOverrides).
           sideEffects & SideEffects_ValueOf) == SideEffects_None) {
        value_00 = DateImplementation::GetMilliSeconds(&this_02->m_date);
        pvVar6 = JavascriptNumber::ToVarNoCheck(value_00,requestContext);
        return pvVar6;
      }
      goto LAB_00a8ffb4;
    }
    if (TVar1 == TypeIds_NumberObject) {
      this_02 = (JavascriptDate *)UnsafeVarTo<Js::JavascriptNumberObject>(aValue);
      objectScriptContext =
           (((((this_02->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
            ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      if (((objectScriptContext->optimizationOverrides).sideEffects & SideEffects_ValueOf) ==
          SideEffects_None) {
        value = (JavascriptString *)
                JavascriptNumberObject::Unwrap((JavascriptNumberObject *)this_02);
        goto LAB_00a8ff7e;
      }
      goto LAB_00a8ffb4;
    }
  }
  else {
    if (TVar1 == TypeIds_SymbolObject) {
      this_02 = (JavascriptDate *)UnsafeVarTo<Js::JavascriptSymbolObject>(aValue);
      objectScriptContext =
           (((((this_02->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
            ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      if (((objectScriptContext->optimizationOverrides).sideEffects & SideEffects_ToPrimitive) ==
          SideEffects_None) {
        value = (JavascriptString *)
                JavascriptSymbolObject::Unwrap((JavascriptSymbolObject *)this_02);
LAB_00a8ff7e:
        pvVar6 = CrossSite::MarshalVar(requestContext,value,objectScriptContext);
        return pvVar6;
      }
      goto LAB_00a8ffb4;
    }
    if (TVar1 == TypeIds_StringObject) {
      this_02 = (JavascriptDate *)UnsafeVarTo<Js::JavascriptStringObject>(aValue);
      objectScriptContext =
           (((((this_02->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
            ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      if (((objectScriptContext->optimizationOverrides).sideEffects & SideEffects_ValueOf) ==
          SideEffects_None) {
        value = JavascriptStringObject::InternalUnwrap((JavascriptStringObject *)this_02);
        goto LAB_00a8ff7e;
      }
      goto LAB_00a8ffb4;
    }
  }
  this_02 = (JavascriptDate *)UnsafeVarTo<Js::RecyclableObject>(aValue);
LAB_00a8ffb4:
  pvVar6 = MethodCallToPrimitive<(Js::JavascriptHint)2>((RecyclableObject *)this_02,requestContext);
  return pvVar6;
}

Assistant:

Var JavascriptConversion::ToPrimitive(_In_ Var aValue, _In_ ScriptContext * requestContext)
    {
        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Undefined:
        case TypeIds_Null:
        case TypeIds_Integer:
        case TypeIds_Boolean:
        case TypeIds_Number:
        case TypeIds_String:
        case TypeIds_Symbol:
        case TypeIds_BigInt:
            return aValue;

        case TypeIds_StringObject:
            {
                JavascriptStringObject * stringObject = UnsafeVarTo<JavascriptStringObject>(aValue);
                ScriptContext * objectScriptContext = stringObject->GetScriptContext();
                if (objectScriptContext->optimizationOverrides.GetSideEffects() & (hint == JavascriptHint::HintString ? SideEffects_ToString : SideEffects_ValueOf))
                {
                    return MethodCallToPrimitive<hint>(stringObject, requestContext);
                }

                return CrossSite::MarshalVar(requestContext, stringObject->Unwrap(), objectScriptContext);
            }

        case TypeIds_NumberObject:
            {
                JavascriptNumberObject * numberObject = UnsafeVarTo<JavascriptNumberObject>(aValue);
                ScriptContext * objectScriptContext = numberObject->GetScriptContext();
                if (hint == JavascriptHint::HintString)
                {
                    if (objectScriptContext->optimizationOverrides.GetSideEffects() & SideEffects_ToString)
                    {
                        return MethodCallToPrimitive<hint>(numberObject, requestContext);
                    }
                    return JavascriptNumber::ToStringRadix10(numberObject->GetValue(), requestContext);
                }
                else
                {
                    if (objectScriptContext->optimizationOverrides.GetSideEffects() & SideEffects_ValueOf)
                    {
                        return MethodCallToPrimitive<hint>(numberObject, requestContext);
                    }

                    return CrossSite::MarshalVar(requestContext, numberObject->Unwrap(), objectScriptContext);
                }
            }


        case TypeIds_SymbolObject:
            {
                JavascriptSymbolObject* symbolObject = UnsafeVarTo<JavascriptSymbolObject>(aValue);
                ScriptContext* objectScriptContext = symbolObject->GetScriptContext();
                if (objectScriptContext->optimizationOverrides.GetSideEffects() & SideEffects_ToPrimitive)
                {
                    return MethodCallToPrimitive<hint>(symbolObject, requestContext);
                }

                return CrossSite::MarshalVar(requestContext, symbolObject->Unwrap(), objectScriptContext);
            }

        case TypeIds_Date:
            {
                JavascriptDate* dateObject = UnsafeVarTo<JavascriptDate>(aValue);
                if(hint == JavascriptHint::HintNumber)
                {
                    if (dateObject->GetScriptContext()->optimizationOverrides.GetSideEffects() & SideEffects_ValueOf)
                    {
                        // if no Method exists this function falls back to OrdinaryToPrimitive
                        // if IsES6ToPrimitiveEnabled flag is off we also fall back to OrdinaryToPrimitive
                        return MethodCallToPrimitive<hint>(dateObject, requestContext);
                    }
                    return JavascriptNumber::ToVarNoCheck(dateObject->GetTime(), requestContext);
                }
                else
                {
                    if (dateObject->GetScriptContext()->optimizationOverrides.GetSideEffects() & SideEffects_ToString)
                    {
                        // if no Method exists this function falls back to OrdinaryToPrimitive
                        // if IsES6ToPrimitiveEnabled flag is off we also fall back to OrdinaryToPrimitive
                        return MethodCallToPrimitive<hint>(dateObject, requestContext);
                    }
                    return JavascriptDate::ToString(dateObject, requestContext);
                }
            }

        // convert to JavascriptNumber
        case TypeIds_Int64Number:
            return UnsafeVarTo<JavascriptInt64Number>(aValue)->ToJavascriptNumber();
        case TypeIds_UInt64Number:
            return UnsafeVarTo<JavascriptUInt64Number>(aValue)->ToJavascriptNumber();

        default:
            // if no Method exists this function falls back to OrdinaryToPrimitive
            // if IsES6ToPrimitiveEnabled flag is off we also fall back to OrdinaryToPrimitive
            return MethodCallToPrimitive<hint>(UnsafeVarTo<RecyclableObject>(aValue), requestContext);
        }
    }